

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

void cxxopts::values::detail::check_signed_range<int,unsigned_int>
               (bool negative,uint value,string *text)

{
  undefined7 in_register_00000039;
  
  if ((int)CONCAT71(in_register_00000039,negative) == 0) {
    if (-1 < (int)value) {
      return;
    }
  }
  else if (value < 0x80000001) {
    return;
  }
  throw_or_mimic<cxxopts::exceptions::incorrect_argument_type>(text);
  return;
}

Assistant:

void
  operator()(bool negative, U u, const std::string& text)
  {
    if (negative)
    {
      if (u > static_cast<U>((std::numeric_limits<T>::min)()))
      {
        throw_or_mimic<exceptions::incorrect_argument_type>(text);
      }
    }
    else
    {
      if (u > static_cast<U>((std::numeric_limits<T>::max)()))
      {
        throw_or_mimic<exceptions::incorrect_argument_type>(text);
      }
    }
  }